

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
node::BlockManager::ReadBlockFromDisk(BlockManager *this,CBlock *block,FlatFilePos *pos)

{
  CChainParams *consensusParams;
  uint256 hash;
  base_blob<256U> *pbVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  AutoFile filein;
  uint256 local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  (block->super_CBlockHeader).nBits = 0;
  (block->super_CBlockHeader).nNonce = 0;
  pbVar1 = &(block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0xc] = '\0';
  (pbVar1->m_data)._M_elems[0xd] = '\0';
  (pbVar1->m_data)._M_elems[0xe] = '\0';
  (pbVar1->m_data)._M_elems[0xf] = '\0';
  (pbVar1->m_data)._M_elems[0x10] = '\0';
  (pbVar1->m_data)._M_elems[0x11] = '\0';
  (pbVar1->m_data)._M_elems[0x12] = '\0';
  (pbVar1->m_data)._M_elems[0x13] = '\0';
  pbVar1 = &(block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0x14] = '\0';
  (pbVar1->m_data)._M_elems[0x15] = '\0';
  (pbVar1->m_data)._M_elems[0x16] = '\0';
  (pbVar1->m_data)._M_elems[0x17] = '\0';
  (pbVar1->m_data)._M_elems[0x18] = '\0';
  (pbVar1->m_data)._M_elems[0x19] = '\0';
  (pbVar1->m_data)._M_elems[0x1a] = '\0';
  (pbVar1->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  pbVar1 = &(block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[4] = '\0';
  (pbVar1->m_data)._M_elems[5] = '\0';
  (pbVar1->m_data)._M_elems[6] = '\0';
  (pbVar1->m_data)._M_elems[7] = '\0';
  (pbVar1->m_data)._M_elems[8] = '\0';
  (pbVar1->m_data)._M_elems[9] = '\0';
  (pbVar1->m_data)._M_elems[10] = '\0';
  (pbVar1->m_data)._M_elems[0xb] = '\0';
  pbVar1 = &(block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0xc] = '\0';
  (pbVar1->m_data)._M_elems[0xd] = '\0';
  (pbVar1->m_data)._M_elems[0xe] = '\0';
  (pbVar1->m_data)._M_elems[0xf] = '\0';
  (pbVar1->m_data)._M_elems[0x10] = '\0';
  (pbVar1->m_data)._M_elems[0x11] = '\0';
  (pbVar1->m_data)._M_elems[0x12] = '\0';
  (pbVar1->m_data)._M_elems[0x13] = '\0';
  pbVar1 = &(block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0x14] = '\0';
  (pbVar1->m_data)._M_elems[0x15] = '\0';
  (pbVar1->m_data)._M_elems[0x16] = '\0';
  (pbVar1->m_data)._M_elems[0x17] = '\0';
  (pbVar1->m_data)._M_elems[0x18] = '\0';
  (pbVar1->m_data)._M_elems[0x19] = '\0';
  (pbVar1->m_data)._M_elems[0x1a] = '\0';
  (pbVar1->m_data)._M_elems[0x1b] = '\0';
  (block->super_CBlockHeader).nVersion = 0;
  (block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pbVar1 = &(block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[4] = '\0';
  (pbVar1->m_data)._M_elems[5] = '\0';
  (pbVar1->m_data)._M_elems[6] = '\0';
  (pbVar1->m_data)._M_elems[7] = '\0';
  (pbVar1->m_data)._M_elems[8] = '\0';
  (pbVar1->m_data)._M_elems[9] = '\0';
  (pbVar1->m_data)._M_elems[10] = '\0';
  (pbVar1->m_data)._M_elems[0xb] = '\0';
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear(&block->vtx);
  block->fChecked = false;
  block->m_checked_witness_commitment = false;
  block->m_checked_merkle_root = false;
  OpenBlockFile(&filein,this,pos,true);
  if (filein.m_file == (FILE *)0x0) {
    FlatFilePos::ToString_abi_cxx11_(&local_50,pos);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x65;
    logging_function_00._M_str = "ReadBlockFromDisk";
    logging_function_00._M_len = 0x11;
    LogPrintFormatInternal<char[18],std::__cxx11::string>
              (logging_function_00,source_file_00,0x40c,ALL,Error,
               (ConstevalFormatString<2U>)0xf7ea17,(char (*) [18])"ReadBlockFromDisk",&local_50);
  }
  else {
    CBlock::SerializationOps<ParamsStream<AutoFile&,TransactionSerParams>,CBlock,ActionUnserialize>
              (block);
    CBlockHeader::GetHash(&local_70,&block->super_CBlockHeader);
    hash.super_base_blob<256U>.m_data._M_elems[8] =
         local_70.super_base_blob<256U>.m_data._M_elems[8];
    hash.super_base_blob<256U>.m_data._M_elems[9] =
         local_70.super_base_blob<256U>.m_data._M_elems[9];
    hash.super_base_blob<256U>.m_data._M_elems[10] =
         local_70.super_base_blob<256U>.m_data._M_elems[10];
    hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_70.super_base_blob<256U>.m_data._M_elems[0xb];
    hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_70.super_base_blob<256U>.m_data._M_elems[0xc];
    hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_70.super_base_blob<256U>.m_data._M_elems[0xd];
    hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_70.super_base_blob<256U>.m_data._M_elems[0xe];
    hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_70.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems[0] =
         local_70.super_base_blob<256U>.m_data._M_elems[0];
    hash.super_base_blob<256U>.m_data._M_elems[1] =
         local_70.super_base_blob<256U>.m_data._M_elems[1];
    hash.super_base_blob<256U>.m_data._M_elems[2] =
         local_70.super_base_blob<256U>.m_data._M_elems[2];
    hash.super_base_blob<256U>.m_data._M_elems[3] =
         local_70.super_base_blob<256U>.m_data._M_elems[3];
    hash.super_base_blob<256U>.m_data._M_elems[4] =
         local_70.super_base_blob<256U>.m_data._M_elems[4];
    hash.super_base_blob<256U>.m_data._M_elems[5] =
         local_70.super_base_blob<256U>.m_data._M_elems[5];
    hash.super_base_blob<256U>.m_data._M_elems[6] =
         local_70.super_base_blob<256U>.m_data._M_elems[6];
    hash.super_base_blob<256U>.m_data._M_elems[7] =
         local_70.super_base_blob<256U>.m_data._M_elems[7];
    hash.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x10];
    hash.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x11];
    hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x12];
    hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x13];
    hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x14];
    hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x15];
    hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x16];
    hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x17];
    hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x18];
    hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x19];
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x1a];
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x1b];
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x1c];
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x1d];
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x1e];
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_70.super_base_blob<256U>.m_data._M_elems[0x1f];
    bVar2 = CheckProofOfWork(hash,(block->super_CBlockHeader).nBits,
                             &((this->m_opts).chainparams)->consensus);
    if (bVar2) {
      consensusParams = (this->m_opts).chainparams;
      bVar2 = true;
      if ((consensusParams->consensus).signet_blocks != true) goto LAB_0091457c;
      bVar3 = CheckSignetBlockSolution(block,&consensusParams->consensus);
      if (bVar3) goto LAB_0091457c;
      FlatFilePos::ToString_abi_cxx11_(&local_50,pos);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x65;
      logging_function._M_str = "ReadBlockFromDisk";
      logging_function._M_len = 0x11;
      LogPrintFormatInternal<char[18],std::__cxx11::string>
                (logging_function,source_file,0x420,ALL,Error,(ConstevalFormatString<2U>)0xf7ea5a,
                 (char (*) [18])"ReadBlockFromDisk",&local_50);
    }
    else {
      FlatFilePos::ToString_abi_cxx11_(&local_50,pos);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_01._M_len = 0x65;
      logging_function_01._M_str = "ReadBlockFromDisk";
      logging_function_01._M_len = 0x11;
      LogPrintFormatInternal<char[18],std::__cxx11::string>
                (logging_function_01,source_file_01,0x41a,ALL,Error,
                 (ConstevalFormatString<2U>)0xf7ea38,(char (*) [18])"ReadBlockFromDisk",&local_50);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_0091457c:
  AutoFile::~AutoFile(&filein);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadBlockFromDisk(CBlock& block, const FlatFilePos& pos) const
{
    block.SetNull();

    // Open history file to read
    AutoFile filein{OpenBlockFile(pos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    // Read block
    try {
        filein >> TX_WITH_WITNESS(block);
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s at %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    // Check the header
    if (!CheckProofOfWork(block.GetHash(), block.nBits, GetConsensus())) {
        LogError("%s: Errors in block header at %s\n", __func__, pos.ToString());
        return false;
    }

    // Signet only: check block solution
    if (GetConsensus().signet_blocks && !CheckSignetBlockSolution(block, GetConsensus())) {
        LogError("%s: Errors in block solution at %s\n", __func__, pos.ToString());
        return false;
    }

    return true;
}